

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *__s;
  byte bVar6;
  bool DumpToFileAppend_result;
  bool DumpToFile_result;
  bool ArrayAllocation_result;
  bool MultipleAllocations_result;
  bool BasicTest_result;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  
  local_29 = true;
  BasicTest(&local_29);
  bVar5 = local_29;
  if (local_29 == true) {
    printf("%-30s: PASSED\n","BasicTest");
  }
  local_2a = true;
  MultipleAllocations(&local_2a);
  bVar4 = local_2a;
  if (local_2a == true) {
    printf("%-30s: PASSED\n","MultipleAllocations");
  }
  local_2b = true;
  ArrayAllocation(&local_2b);
  bVar3 = local_2b;
  if (local_2b == true) {
    printf("%-30s: PASSED\n","ArrayAllocation");
  }
  local_2c = true;
  DumpToFile(&local_2c);
  bVar2 = local_2c;
  if (local_2c == true) {
    printf("%-30s: PASSED\n","DumpToFile");
  }
  local_2d = true;
  DumpToFileAppend(&local_2d);
  bVar1 = local_2d;
  if (local_2d == true) {
    printf("%-30s: PASSED\n","DumpToFileAppend");
  }
  bVar6 = bVar3 & bVar2 & bVar4 & bVar5 & bVar1;
  __s = "ALL TESTS PASSED!!\n\n";
  if (bVar6 == 0) {
    __s = "NOT ALL TESTS PASSED!!\n\n";
  }
  puts(__s);
  return (uint)(bVar6 ^ 1);
}

Assistant:

int MAIN(int argc, char* argv[]) {

    START_RUNNING_TESTS;
    
    RUN_TEST(BasicTest);
    
    #if !defined _MSC_VER || !defined _DEBUG
    RUN_TEST(MultipleAllocations);
    RUN_TEST(ArrayAllocation);
    #else
    SKIP_TEST(MultipleAllocations, "Additional debug allocations made by VS make it difficult to track real memory allocations");
    SKIP_TEST(ArrayAllocation, "Additional debug allocations made by VS make it difficult to track real memory allocations");
    #endif

    RUN_TEST(DumpToFile);
    RUN_TEST(DumpToFileAppend);

    END_RUNNING_TESTS;
}